

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmCpGen<(moira::Instr)149,(moira::Mode)12,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  int iVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char cVar6;
  
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    dasmIllegal<(moira::Instr)149,(moira::Mode)12,0>(this,str,addr,op);
    return;
  }
  *addr = *addr + 2;
  iVar3 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[6])(this);
  s = &str->ptr;
  sprintd_signed(s,(ulong)(op >> 9 & 7));
  cVar6 = 'g';
  lVar5 = 1;
  do {
    pcVar2 = *s;
    *s = pcVar2 + 1;
    *pcVar2 = cVar6;
    cVar6 = "gen"[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar2 = *s;
    *s = pcVar2 + 1;
    *pcVar2 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    } while (str->ptr < str->base + iVar1);
  }
  pcVar2 = str->ptr;
  str->ptr = pcVar2 + 1;
  *pcVar2 = '#';
  StrWriter::operator<<(str,(UInt)(iVar3 << 0x10 | uVar4 & 0xffff));
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar6 = ';';
    lVar5 = 1;
    do {
      pcVar2 = *s;
      *s = pcVar2 + 1;
      *pcVar2 = cVar6;
      cVar6 = "%dgen    %s; (2-3)"[lVar5 + 0xb];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
  }
  return;
}

Assistant:

void
Moira::dasmCpGen(StrWriter &str, u32 &addr, u16 op) const
{
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    auto id  = ( ____xxx_________(op) );
    auto ext = Imu ( dasmIncRead<Long>(addr) );

    str << id << Ins<I>{} << str.tab << ext;
    str << Av<I, M, S>{};
}